

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

leb_NodeAndNeighbors *
leb_DecodeNodeAndNeighbors
          (leb_NodeAndNeighbors *__return_storage_ptr__,leb_Heap *leb,uint32_t threadID)

{
  undefined1 auVar1 [12];
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  leb_Node lVar7;
  leb_SameDepthNeighborIDs nodeIDs;
  
  uVar6 = 1;
  uVar2 = leb__HeapRead(leb,(leb_Node)0x1);
  if (uVar2 < 2) {
    uVar6 = 1;
    iVar4 = 0;
    auVar1 = SUB1612(ZEXT816(0),0);
  }
  else {
    lVar5 = 0x100000000;
    iVar4 = 0;
    nodeIDs = (leb_SameDepthNeighborIDs)(ZEXT816(0x100000000) << 0x40);
    do {
      uVar3 = leb__HeapRead(leb,(leb_Node)((ulong)(uint)((int)uVar6 * 2) + lVar5));
      uVar2 = uVar3;
      if (uVar3 > threadID) {
        uVar2 = 0;
      }
      nodeIDs = leb__SplitNodeIDs(nodeIDs,(uint)(uVar3 <= threadID));
      auVar1 = nodeIDs._0_12_;
      threadID = threadID - uVar2;
      uVar6 = nodeIDs._8_8_ >> 0x20;
      uVar2 = leb__HeapRead(leb,(leb_Node)(lVar5 + uVar6));
      iVar4 = iVar4 + 1;
      lVar5 = lVar5 + 0x100000000;
    } while (1 < uVar2);
  }
  (__return_storage_ptr__->left).id = auVar1._0_4_;
  (__return_storage_ptr__->left).depth = iVar4;
  (__return_storage_ptr__->right).id = auVar1._4_4_;
  (__return_storage_ptr__->right).depth = iVar4;
  (__return_storage_ptr__->edge).id = auVar1._8_4_;
  (__return_storage_ptr__->edge).depth = iVar4;
  (__return_storage_ptr__->node).id = (uint32_t)uVar6;
  (__return_storage_ptr__->node).depth = iVar4;
  lVar7 = __return_storage_ptr__->edge;
  uVar2 = leb__HeapRead(leb,lVar7);
  if (uVar2 != 1) {
    if (lVar7.id != lVar7.depth) {
      lVar7 = (leb_Node)
              (((ulong)lVar7 & 0xffffffff00000000 | (ulong)lVar7 >> 1 & 0x7fffffff) - 0x100000000);
    }
    __return_storage_ptr__->edge = lVar7;
  }
  lVar7 = __return_storage_ptr__->left;
  uVar2 = leb__HeapRead(leb,lVar7);
  if (uVar2 != 1) {
    if (lVar7.id != lVar7.depth) {
      lVar7 = (leb_Node)
              ((ulong)(lVar7.id * 2) | ((ulong)lVar7 & 0xffffffff00000000) + 0x100000000 | 1);
    }
    __return_storage_ptr__->left = lVar7;
  }
  lVar7 = __return_storage_ptr__->right;
  uVar2 = leb__HeapRead(leb,lVar7);
  if (uVar2 != 1) {
    if (lVar7.id != lVar7.depth) {
      lVar7 = (leb_Node)((ulong)(lVar7.id * 2) | ((ulong)lVar7 & 0xffffffff00000000) + 0x100000000);
    }
    __return_storage_ptr__->right = lVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

LEBDEF leb_NodeAndNeighbors
leb_DecodeNodeAndNeighbors(const leb_Heap *leb, uint32_t threadID)
{
#define nodeID nodeIDs._reserved
    leb_SameDepthNeighborIDs nodeIDs = {0u, 0u, 0u, 1u};
    int32_t nodeDepth = 0;

    while (leb__HeapRead(leb, {nodeID, nodeDepth}) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {nodeID << 1u, ++nodeDepth});
        uint32_t b = threadID < cmp ? 0u : 1u;

        nodeIDs = leb__SplitNodeIDs(nodeIDs, b);
        threadID-= cmp * b;
    }

    return leb__NodeAndNeighborsFromSameDepthNeighborIDs(leb, nodeIDs, nodeDepth);
#undef nodeID
}